

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adopt.c
# Opt level: O0

lws * lws_adopt_descriptor_vhost2(lws *new_wsi,lws_adoption_type type,lws_sock_file_fd_type fd)

{
  int iVar1;
  lws_log_cx *plVar2;
  lws_callback_reasons local_34;
  int n;
  lws_context_per_thread *pt;
  lws_adoption_type type_local;
  lws *new_wsi_local;
  lws_sock_file_fd_type fd_local;
  
  pt._4_4_ = type;
  if ((type & LWS_ADOPT_SOCKET) == LWS_ADOPT_RAW_FILE_DESC) {
    iVar1 = lws_plat_set_nonblocking(fd.sockfd);
    if (iVar1 != 0) {
      plVar2 = lwsl_wsi_get_cx(new_wsi);
      _lws_log_cx(plVar2,lws_log_prepend_wsi,new_wsi,1,"lws_adopt_descriptor_vhost2",
                  "unable to set filefd nonblocking");
      goto LAB_001586b7;
    }
  }
  else {
    iVar1 = lws_plat_set_nonblocking(fd.sockfd);
    if (iVar1 != 0) {
      plVar2 = lwsl_wsi_get_cx(new_wsi);
      _lws_log_cx(plVar2,lws_log_prepend_wsi,new_wsi,1,"lws_adopt_descriptor_vhost2",
                  "unable to set sockfd %d nonblocking",fd.sockfd);
      goto LAB_001586b7;
    }
  }
  new_wsi->desc = fd;
  if ((((new_wsi->a).vhost == (lws_vhost *)0x0) || ((((new_wsi->a).vhost)->tls).use_ssl == 0)) ||
     ((type & LWS_ADOPT_SOCKET) == LWS_ADOPT_RAW_FILE_DESC)) {
    pt._4_4_ = type & ~LWS_ADOPT_ALLOW_SSL;
  }
  new_wsi->wsistate = new_wsi->wsistate | 0x20000000;
  local_34 = LWS_CALLBACK_SERVER_NEW_CLIENT_INSTANTIATED;
  if (new_wsi->role_ops->adoption_cb[(int)(uint)((new_wsi->wsistate & 0x20000000) != 0)] != '\0') {
    local_34 = (lws_callback_reasons)
               new_wsi->role_ops->adoption_cb[(int)(uint)((new_wsi->wsistate & 0x20000000) != 0)];
  }
  if ((((new_wsi->a).context)->event_loop_ops->sock_accept == (_func_int_lws_ptr *)0x0) ||
     (iVar1 = (*((new_wsi->a).context)->event_loop_ops->sock_accept)(new_wsi), iVar1 == 0)) {
    if ((pt._4_4_ & LWS_ADOPT_ALLOW_SSL) == LWS_ADOPT_RAW_FILE_DESC) {
      iVar1 = __insert_wsi_socket_into_fds((new_wsi->a).context,new_wsi);
      if (iVar1 != 0) {
        plVar2 = lwsl_wsi_get_cx(new_wsi);
        _lws_log_cx(plVar2,lws_log_prepend_wsi,new_wsi,1,"lws_adopt_descriptor_vhost2",
                    "fail inserting socket");
        goto LAB_001586b7;
      }
    }
    else {
      iVar1 = lws_server_socket_service_ssl(new_wsi,fd.sockfd,'\0');
      if (iVar1 != 0) {
        plVar2 = lwsl_wsi_get_cx(new_wsi);
        _lws_log_cx(plVar2,lws_log_prepend_wsi,new_wsi,8,"lws_adopt_descriptor_vhost2",
                    "fail ssl negotiation");
        goto LAB_001586b7;
      }
    }
    lws_dll2_remove(&new_wsi->vh_awaiting_socket);
    iVar1 = (*((new_wsi->a).protocol)->callback)(new_wsi,local_34,new_wsi->user_space,(void *)0x0,0)
    ;
    if (iVar1 == 0) {
      lws_role_call_adoption_bind(new_wsi,pt._4_4_ | 0x1000000,((new_wsi->a).protocol)->name);
      lws_cancel_service_pt(new_wsi);
      return new_wsi;
    }
  }
LAB_001586b7:
  if ((pt._4_4_ & LWS_ADOPT_SOCKET) != LWS_ADOPT_RAW_FILE_DESC) {
    lws_close_free_wsi(new_wsi,LWS_CLOSE_STATUS_NOSTATUS,"adopt skt fail");
  }
  return (lws *)0x0;
}

Assistant:

static struct lws *
lws_adopt_descriptor_vhost2(struct lws *new_wsi, lws_adoption_type type,
			    lws_sock_file_fd_type fd)
{
	struct lws_context_per_thread *pt =
			&new_wsi->a.context->pt[(int)new_wsi->tsi];
	int n;

	/* enforce that every fd is nonblocking */

	if (type & LWS_ADOPT_SOCKET) {
		if (lws_plat_set_nonblocking(fd.sockfd)) {
			lwsl_wsi_err(new_wsi, "unable to set sockfd %d nonblocking",
				     fd.sockfd);
			goto fail;
		}
	}
#if !defined(WIN32)
	else
		if (lws_plat_set_nonblocking(fd.filefd)) {
			lwsl_wsi_err(new_wsi, "unable to set filefd nonblocking");
			goto fail;
		}
#endif

	new_wsi->desc = fd;

	if (!LWS_SSL_ENABLED(new_wsi->a.vhost) ||
	    !(type & LWS_ADOPT_SOCKET))
		type &= (unsigned int)~LWS_ADOPT_ALLOW_SSL;

	/*
	 * A new connection was accepted. Give the user a chance to
	 * set properties of the newly created wsi. There's no protocol
	 * selected yet so we issue this to the vhosts's default protocol,
	 * itself by default protocols[0]
	 */
	new_wsi->wsistate |= LWSIFR_SERVER;
	n = LWS_CALLBACK_SERVER_NEW_CLIENT_INSTANTIATED;
	if (new_wsi->role_ops->adoption_cb[lwsi_role_server(new_wsi)])
		n = new_wsi->role_ops->adoption_cb[lwsi_role_server(new_wsi)];

	if (new_wsi->a.context->event_loop_ops->sock_accept)
		if (new_wsi->a.context->event_loop_ops->sock_accept(new_wsi))
			goto fail;

#if LWS_MAX_SMP > 1
	/*
	 * Caution: after this point the wsi is live on its service thread
	 * which may be concurrent to this.  We mark the wsi as still undergoing
	 * init in another pt so the assigned pt leaves it alone.
	 */
	new_wsi->undergoing_init_from_other_pt = 1;
#endif

	if (!(type & LWS_ADOPT_ALLOW_SSL)) {
		lws_pt_lock(pt, __func__);
		if (__insert_wsi_socket_into_fds(new_wsi->a.context, new_wsi)) {
			lws_pt_unlock(pt);
			lwsl_wsi_err(new_wsi, "fail inserting socket");
			goto fail;
		}
		lws_pt_unlock(pt);
	}
#if defined(LWS_WITH_SERVER)
	 else
		if (lws_server_socket_service_ssl(new_wsi, fd.sockfd, 0)) {
			lwsl_wsi_info(new_wsi, "fail ssl negotiation");

			goto fail;
		}
#endif

	lws_vhost_lock(new_wsi->a.vhost);
	/* he has fds visibility now, remove from vhost orphan list */
	lws_dll2_remove(&new_wsi->vh_awaiting_socket);
	lws_vhost_unlock(new_wsi->a.vhost);

	/*
	 *  by deferring callback to this point, after insertion to fds,
	 * lws_callback_on_writable() can work from the callback
	 */
	if ((new_wsi->a.protocol->callback)(new_wsi, (enum lws_callback_reasons)n, new_wsi->user_space,
					  NULL, 0))
		goto fail;

	/* role may need to do something after all adoption completed */

	lws_role_call_adoption_bind(new_wsi, (int)type | _LWS_ADOPT_FINISH,
				    new_wsi->a.protocol->name);

#if defined(LWS_WITH_SERVER) && defined(LWS_WITH_SECURE_STREAMS)
	/*
	 * Did we come from an accepted client connection to a ss server?
	 *
	 * !!! For mux protocols, this will cause an additional inactive ss
	 * representing the nwsi.  Doing that allows us to support both h1
	 * (here) and h2 (at __lws_wsi_server_new())
	 */

	lwsl_wsi_info(new_wsi, "vhost %s", new_wsi->a.vhost->lc.gutag);

	if (lws_adopt_ss_server_accept(new_wsi))
		goto fail;
#endif

#if LWS_MAX_SMP > 1
	/* its actual pt can service it now */

	new_wsi->undergoing_init_from_other_pt = 0;
#endif

	lws_cancel_service_pt(new_wsi);

	return new_wsi;

fail:
	if (type & LWS_ADOPT_SOCKET)
		lws_close_free_wsi(new_wsi, LWS_CLOSE_STATUS_NOSTATUS,
				   "adopt skt fail");

	return NULL;
}